

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_compare.cpp
# Opt level: O2

void __thiscall ktx::PrintDiff::operator<<(PrintDiff *this,DiffBase<_khr_df_model_channels_e> *diff)

{
  OutputFormat OVar1;
  PrintIndent *pPVar2;
  char *nl;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  char *space;
  
  if (diff->different == true) {
    this->different = true;
    OVar1 = this->outputFormat;
    space = " ";
    if (OVar1 == json_mini) {
      space = "";
    }
    nl = "\n";
    if (OVar1 == json_mini) {
      nl = "";
    }
    if (OVar1 == text) {
      printContext(this);
      if (diff->values[0].super__Optional_base<_khr_df_model_channels_e,_true,_true>._M_payload.
          super__Optional_payload_base<_khr_df_model_channels_e>._M_engaged == true) {
        pPVar2 = this->printIndent;
        (**diff->_vptr_DiffBase)(&local_50,diff,0,(ulong)this->outputFormat);
        PrintIndent::operator()(pPVar2,0,(char (*) [9])"-{}: {}\n",&diff->textHeader,&local_50);
        std::__cxx11::string::~string((string *)&local_50);
      }
      if (diff->values[1].super__Optional_base<_khr_df_model_channels_e,_true,_true>._M_payload.
          super__Optional_payload_base<_khr_df_model_channels_e>._M_engaged == true) {
        pPVar2 = this->printIndent;
        (**diff->_vptr_DiffBase)(&local_50,diff,1,(ulong)this->outputFormat);
        PrintIndent::operator()(pPVar2,0,(char (*) [9])"+{}: {}\n",&diff->textHeader,&local_50);
        std::__cxx11::string::~string((string *)&local_50);
      }
    }
    else {
      beginJsonOutput(this);
      PrintIndent::operator()
                (this->printIndent,2,(char (*) [11])"\"{}\":{}[{}",&diff->jsonPath,&space,&nl);
      pPVar2 = this->printIndent;
      if (diff->values[0].super__Optional_base<_khr_df_model_channels_e,_true,_true>._M_payload.
          super__Optional_payload_base<_khr_df_model_channels_e>._M_engaged == true) {
        (**diff->_vptr_DiffBase)(&local_50,diff,0,(ulong)this->outputFormat);
        PrintIndent::operator()(pPVar2,3,(char (*) [6])0x1d113f,&local_50,&nl);
        std::__cxx11::string::~string((string *)&local_50);
      }
      else {
        PrintIndent::operator()(pPVar2,3,(char (*) [8])"null,{}",&nl);
      }
      pPVar2 = this->printIndent;
      if (diff->values[1].super__Optional_base<_khr_df_model_channels_e,_true,_true>._M_payload.
          super__Optional_payload_base<_khr_df_model_channels_e>._M_engaged == true) {
        (**diff->_vptr_DiffBase)(&local_50,diff,1,(ulong)this->outputFormat);
        PrintIndent::operator()(pPVar2,3,(char (*) [5])0x1e185e,&local_50,&nl);
        std::__cxx11::string::~string((string *)&local_50);
      }
      else {
        PrintIndent::operator()(pPVar2,3,(char (*) [7])"null{}",&nl);
      }
      PrintIndent::operator()(this->printIndent,2,(char (*) [2])0x1d9cf4);
    }
  }
  return;
}

Assistant:

void operator<<(const DiffBase<T>& diff) {
        if (!diff.isDifferent()) return;
        different = true;

        const auto space = outputFormat != OutputFormat::json_mini ?  " " : "";
        const auto nl = outputFormat != OutputFormat::json_mini ?  "\n" : "";

        if (outputFormat == OutputFormat::text) {
            printContext();
            if (diff.hasValue(0))
                printIndent(0, "-{}: {}\n", diff.textHeader, diff.value(0, outputFormat));
            if (diff.hasValue(1))
                printIndent(0, "+{}: {}\n", diff.textHeader, diff.value(1, outputFormat));
        } else {
            beginJsonOutput();
            printIndent(2, "\"{}\":{}[{}", diff.jsonPath, space, nl);
            if (diff.hasValue(0))
                printIndent(3, "{},{}", diff.value(0, outputFormat), nl);
            else
                printIndent(3, "null,{}", nl);
            if (diff.hasValue(1))
                printIndent(3, "{}{}", diff.value(1, outputFormat), nl);
            else
                printIndent(3, "null{}", nl);
            printIndent(2, "]");
        }
    }